

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

void __thiscall nuraft::buffer::put(buffer *this,buffer *buf)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  overflow_error *this_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong __n;
  
  uVar1 = *(uint *)this;
  uVar5 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar5 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar6 = *(uint *)(this + 4);
  }
  else {
    uVar6 = uVar1 >> 0x10;
  }
  uVar2 = *(uint *)buf;
  uVar8 = 0x7fffffff;
  if (-1 < (int)uVar2) {
    uVar8 = 0xffff;
  }
  if ((int)uVar2 < 0) {
    uVar7 = *(uint *)(buf + 4);
  }
  else {
    uVar7 = uVar2 >> 0x10;
  }
  __n = (ulong)(uVar8 & uVar2) - (ulong)uVar7;
  if (__n <= (ulong)(uVar5 & uVar1) - (ulong)uVar6) {
    if ((int)uVar1 < 0) {
      lVar3 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar3 = (ulong)(uVar1 >> 0x10) + 4;
    }
    if ((int)uVar2 < 0) {
      lVar4 = (ulong)*(uint *)(buf + 4) + 8;
    }
    else {
      lVar4 = (ulong)(uVar2 >> 0x10) + 4;
    }
    memcpy(this + lVar3,buf + lVar4,__n);
    if (*(int *)this < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + (int)__n;
    }
    else {
      *(short *)(this + 2) = (short)__n + (short)((uint)*(int *)this >> 0x10);
    }
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer to hold the other buffer");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer::put(const buffer& buf) {
    size_t sz = size();
    size_t p = pos();
    size_t src_sz = buf.size();
    size_t src_p = buf.pos();
    if ((sz - p) < (src_sz - src_p)) {
        throw std::overflow_error
              ( "insufficient buffer to hold the other buffer" );
    }

    byte* d = data();
    byte* src = buf.data();
    ::memcpy(d, src, src_sz - src_p);
    __mv_fw_block(this, src_sz - src_p);
}